

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

void sat_solver_canceluntil(sat_solver *s,int level)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  if (level < (s->trail_lim).size) {
    lVar5 = (long)(s->trail_lim).size;
    if (lVar5 < 1) {
      __assert_fail("veci_size(&s->trail_lim) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x29c,"void sat_solver_canceluntil(sat_solver *, int)");
    }
    piVar3 = (s->trail_lim).ptr;
    iVar1 = piVar3[level];
    lVar4 = (long)s->qtail;
    if (iVar1 < s->qtail) {
      iVar2 = piVar3[lVar5 + -1];
      do {
        iVar6 = s->trail[lVar4 + -1] >> 1;
        s->assigns[iVar6] = '\x03';
        s->reasons[iVar6] = 0;
        if (lVar4 <= iVar2) {
          s->polarity[iVar6] = ~*(byte *)(s->trail + lVar4 + -1) & 1;
        }
        lVar4 = lVar4 + -1;
      } while (iVar1 < lVar4);
    }
    lVar5 = (long)s->qhead;
    if (iVar1 < s->qhead) {
      do {
        lVar4 = lVar5 + -1;
        lVar5 = lVar5 + -1;
        order_unassigned(s,s->trail[lVar4] >> 1);
      } while (iVar1 < lVar5);
    }
    s->qtail = iVar1;
    s->qhead = iVar1;
    if ((s->trail_lim).size < level) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->trail_lim).size = level;
  }
  return;
}

Assistant:

static void sat_solver_canceluntil(sat_solver* s, int level) {
    int      bound;
    int      lastLev;
    int      c;
    
    if (sat_solver_dl(s) <= level)
        return;

    assert( veci_size(&s->trail_lim) > 0 );
    bound   = (veci_begin(&s->trail_lim))[level];
    lastLev = (veci_begin(&s->trail_lim))[veci_size(&s->trail_lim)-1];

    ////////////////////////////////////////
    // added to cancel all assignments
//    if ( level == -1 )
//        bound = 0;
    ////////////////////////////////////////

    for (c = s->qtail-1; c >= bound; c--) {
        int     x  = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
        if ( c < lastLev )
            var_set_polar( s, x, !lit_sign(s->trail[c]) );
    }
    //printf( "\n" );

    for (c = s->qhead-1; c >= bound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = bound;
    veci_resize(&s->trail_lim,level);
}